

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

vec2 golf_config_get_vec2(golf_config_t *cfg,char *name)

{
  golf_config_property_t *pgVar1;
  vec2 vVar2;
  
  pgVar1 = (golf_config_property_t *)map_get_((map_base_t *)cfg,name);
  (cfg->properties).ref = pgVar1;
  if ((pgVar1 != (golf_config_property_t *)0x0) && (pgVar1->type == GOLF_CONFIG_PROPERTY_VEC2)) {
    return (vec2)(pgVar1->field_1).string_val;
  }
  golf_log_warning("Invalid config property %s",name);
  vVar2 = vec2_create(0.0,0.0);
  return vVar2;
}

Assistant:

vec2 golf_config_get_vec2(golf_config_t *cfg, const char *name) {
    golf_config_property_t *prop = map_get(&cfg->properties, name);
    if (prop && prop->type == GOLF_CONFIG_PROPERTY_VEC2) {
        return prop->vec2_val;
    }
    else {
        golf_log_warning("Invalid config property %s", name);
        return V2(0, 0);
    }
}